

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_tanh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  unkuint10 Var3;
  unkuint10 Var4;
  byte zSign;
  byte bVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint uVar8;
  uint64_t uVar9;
  uint16_t uVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 fVar11;
  floatx80 fVar12;
  floatx80 fVar13;
  floatx80 fVar14;
  uint32_t sign;
  floatx80 fp1;
  floatx80 fp0;
  int32_t compact;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t vSig;
  uint64_t aSig;
  int32_t vExp;
  int32_t aExp;
  flag vSign;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var3 = a._0_10_;
  fVar12._10_6_ = 0;
  fVar12.low = (long)Var3;
  fVar12.high = (short)(Var3 >> 0x40);
  uVar9 = extractFloatx80Frac(fVar12);
  fVar13._10_6_ = 0;
  fVar13.low = (long)Var3;
  fVar13.high = (short)(Var3 >> 0x40);
  iVar6 = extractFloatx80Exp(fVar13);
  a_00._10_6_ = 0;
  a_00.low = (long)Var3;
  a_00.high = (short)(Var3 >> 0x40);
  zSign = extractFloatx80Sign(a_00);
  if (iVar6 == 0x7fff) {
    if ((uVar9 & 0x7fffffffffffffff) == 0) {
      fVar11 = packFloatx80(zSign,0x3fff,0x8000000000000000);
      uVar10 = fVar11.high;
    }
    else {
      a_01._10_6_ = 0;
      a_01.low = (long)Var3;
      a_01.high = (short)(Var3 >> 0x40);
      fVar11 = propagateFloatx80NaNOneArg(a_01,status);
      uVar10 = fVar11.high;
    }
  }
  else if ((iVar6 == 0) && (uVar9 == 0)) {
    fVar11 = packFloatx80(zSign,0,0);
    uVar10 = fVar11.high;
  }
  else {
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    iVar7 = floatx80_make_compact(iVar6,uVar9);
    if ((iVar7 < 0x3fd78000) || (0x3fffddce < iVar7)) {
      if (iVar7 < 0x3fff8000) {
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        a_02._10_6_ = 0;
        a_02.low = (long)Var3;
        a_02.high = (short)(Var3 >> 0x40);
        fVar12 = floatx80_move_m68k(a_02,status);
        uVar10 = fVar12.high;
        float_raise_m68k(' ',status);
        fVar11._8_8_ = extraout_RDX;
        fVar11.low = fVar12.low;
      }
      else if (iVar7 < 0x40048aa2) {
        fVar12 = packFloatx80('\0',iVar6 + 1,uVar9);
        a_04._10_6_ = 0;
        a_04.low = (long)fVar12._0_10_;
        a_04.high = (short)(fVar12._0_10_ >> 0x40);
        fVar12 = floatx80_etox_m68k(a_04,status);
        fVar13 = float32_to_floatx80_m68k(0x3f800000,status);
        b_00._10_6_ = 0;
        b_00.low = (long)fVar13._0_10_;
        b_00.high = (short)(fVar13._0_10_ >> 0x40);
        a_05._10_6_ = 0;
        a_05.low = (long)fVar12._0_10_;
        a_05.high = (short)(fVar12._0_10_ >> 0x40);
        fVar12 = floatx80_add_m68k(a_05,b_00,status);
        uVar8 = 0;
        if (zSign != 0) {
          uVar8 = 0x80000000;
        }
        fVar13 = float32_to_floatx80_m68k(uVar8 ^ 0xc0000000,status);
        b_01._10_6_ = 0;
        b_01.low = (long)fVar12._0_10_;
        b_01.high = (short)(fVar12._0_10_ >> 0x40);
        a_06._10_6_ = 0;
        a_06.low = (long)fVar13._0_10_;
        a_06.high = (short)(fVar13._0_10_ >> 0x40);
        fVar12 = floatx80_div_m68k(a_06,b_01,status);
        fVar13 = float32_to_floatx80_m68k(uVar8 | 0x3f800000,status);
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        b_02._10_6_ = 0;
        b_02.low = (long)fVar13._0_10_;
        b_02.high = (short)(fVar13._0_10_ >> 0x40);
        a_07._10_6_ = 0;
        a_07.low = (long)fVar12._0_10_;
        a_07.high = (short)(fVar12._0_10_ >> 0x40);
        fVar12 = floatx80_add_m68k(a_07,b_02,status);
        uVar10 = fVar12.high;
        float_raise_m68k(' ',status);
        fVar11._8_8_ = extraout_RDX_01;
        fVar11.low = fVar12.low;
      }
      else {
        uVar8 = 0;
        if (zSign != 0) {
          uVar8 = 0x80000000;
        }
        fVar12 = float32_to_floatx80_m68k(uVar8 | 0x3f800000,status);
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        fVar13 = float32_to_floatx80_m68k(uVar8 ^ 0x80800000,status);
        b._10_6_ = 0;
        b.low = (long)fVar13._0_10_;
        b.high = (short)(fVar13._0_10_ >> 0x40);
        a_03._10_6_ = 0;
        a_03.low = (long)fVar12._0_10_;
        a_03.high = (short)(fVar12._0_10_ >> 0x40);
        fVar12 = floatx80_add_m68k(a_03,b,status);
        uVar10 = fVar12.high;
        float_raise_m68k(' ',status);
        fVar11._8_8_ = extraout_RDX_00;
        fVar11.low = fVar12.low;
      }
    }
    else {
      fVar12 = packFloatx80('\0',iVar6 + 1,uVar9);
      a_08._10_6_ = 0;
      a_08.low = (long)fVar12._0_10_;
      a_08.high = (short)(fVar12._0_10_ >> 0x40);
      fVar12 = floatx80_etoxm1_m68k(a_08,status);
      fVar13 = float32_to_floatx80_m68k(0x40000000,status);
      Var4 = fVar12._0_10_;
      b_03._10_6_ = 0;
      b_03.low = (long)fVar13._0_10_;
      b_03.high = (short)(fVar13._0_10_ >> 0x40);
      a_09._10_6_ = 0;
      a_09.low = (long)Var4;
      a_09.high = (short)(Var4 >> 0x40);
      fVar12 = floatx80_add_m68k(a_09,b_03,status);
      Var3 = fVar12._0_10_;
      a_10._10_6_ = 0;
      a_10.low = (long)Var3;
      a_10.high = (short)(Var3 >> 0x40);
      bVar5 = extractFloatx80Sign(a_10);
      a_11._10_6_ = 0;
      a_11.low = (long)Var3;
      a_11.high = (short)(Var3 >> 0x40);
      iVar6 = extractFloatx80Exp(a_11);
      a_12._10_6_ = 0;
      a_12.low = (long)Var3;
      a_12.high = (short)(Var3 >> 0x40);
      uVar9 = extractFloatx80Frac(a_12);
      fVar12 = packFloatx80(bVar5 ^ zSign,iVar6,uVar9);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      b_04._10_6_ = 0;
      b_04.low = (long)fVar12._0_10_;
      b_04.high = (short)(fVar12._0_10_ >> 0x40);
      a_13._10_6_ = 0;
      a_13.low = (long)Var4;
      a_13.high = (short)(Var4 >> 0x40);
      fVar12 = floatx80_div_m68k(a_13,b_04,status);
      uVar10 = fVar12.high;
      float_raise_m68k(' ',status);
      fVar11._8_8_ = extraout_RDX_02;
      fVar11.low = fVar12.low;
    }
  }
  a_local._8_8_ = fVar11.low;
  fVar14._10_6_ = fVar11._10_6_;
  fVar14.high = uVar10;
  fVar14.low = a_local._8_8_;
  return fVar14;
}

Assistant:

floatx80 floatx80_tanh(floatx80 a, float_status *status)
{
    flag aSign, vSign;
    int32_t aExp, vExp;
    uint64_t aSig, vSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1;
    uint32_t sign;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return packFloatx80(aSign, one_exp, one_sig);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact < 0x3FD78000 || compact > 0x3FFFDDCE) {
        /* TANHBORS */
        if (compact < 0x3FFF8000) {
            /* TANHSM */
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_move(a, status);

            float_raise(float_flag_inexact, status);

            return a;
        } else {
            if (compact > 0x40048AA1) {
                /* TANHHUGE */
                sign = 0x3F800000;
                sign |= aSign ? 0x80000000 : 0x00000000;
                fp0 = float32_to_floatx80(make_float32(sign), status);
                sign &= 0x80000000;
                sign ^= 0x80800000; /* -SIGN(X)*EPS */

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp0, float32_to_floatx80(make_float32(sign),
                                 status), status);

                float_raise(float_flag_inexact, status);

                return a;
            } else {
                fp0 = packFloatx80(0, aExp + 1, aSig); /* Y = 2|X| */
                fp0 = floatx80_etox(fp0, status); /* FP0 IS EXP(Y) */
                fp0 = floatx80_add(fp0, float32_to_floatx80(
                                   make_float32(0x3F800000),
                                   status), status); /* EXP(Y)+1 */
                sign = aSign ? 0x80000000 : 0x00000000;
                fp1 = floatx80_div(float32_to_floatx80(make_float32(
                                   sign ^ 0xC0000000), status), fp0,
                                   status); /* -SIGN(X)*2 / [EXP(Y)+1] */
                fp0 = float32_to_floatx80(make_float32(sign | 0x3F800000),
                                          status); /* SIGN */

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp1, fp0, status);

                float_raise(float_flag_inexact, status);

                return a;
            }
        }
    } else { /* 2**(-40) < |X| < (5/2)LOG2 */
        fp0 = packFloatx80(0, aExp + 1, aSig); /* Y = 2|X| */
        fp0 = floatx80_etoxm1(fp0, status); /* FP0 IS Z = EXPM1(Y) */
        fp1 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x40000000),
                           status),
                           status); /* Z+2 */

        vSign = extractFloatx80Sign(fp1);
        vExp = extractFloatx80Exp(fp1);
        vSig = extractFloatx80Frac(fp1);

        fp1 = packFloatx80(vSign ^ aSign, vExp, vSig);

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_div(fp0, fp1, status);

        float_raise(float_flag_inexact, status);

        return a;
    }
}